

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall Filter::update(Filter *this,vector<float,_std::allocator<float>_> *newData)

{
  value_type vVar1;
  size_type sVar2;
  const_reference pvVar3;
  float *pfVar4;
  int local_1c;
  int i;
  vector<float,_std::allocator<float>_> *newData_local;
  Filter *this_local;
  
  for (local_1c = 0;
      (local_1c < this->measSize &&
      (sVar2 = std::vector<float,_std::allocator<float>_>::size(newData), sVar2 != (long)local_1c));
      local_1c = local_1c + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](newData,(long)local_1c);
    vVar1 = *pvVar3;
    pfVar4 = cv::Mat::at<float>(&this->meas,local_1c);
    *pfVar4 = vVar1;
  }
  return;
}

Assistant:

void Filter::update(const vector<float> newData) {
    for (int i = 0; i < measSize; i++) {
        if (newData.size() == i)
            return;
        meas.at<float>(i) = newData[i];
    }
}